

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

PFN_vkVoidFunction VK_LAYER_fossilize_GetInstanceProcAddr(VkInstance instance,char *pName)

{
  long lVar1;
  int iVar2;
  Instance *instance_00;
  PFN_vkVoidFunction p_Var3;
  PFN_vkVoidFunction p_Var4;
  unordered_map<void_*,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>_>_>
  *m;
  long lVar5;
  
  if (pName == (char *)0x0) {
    return (PFN_vkVoidFunction)0x0;
  }
  m = (unordered_map<void_*,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>_>_>
       *)pName;
  lVar1 = 0;
  do {
    lVar5 = lVar1;
    if (lVar5 == 0x40) goto LAB_0010fa2b;
    m = (unordered_map<void_*,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>_>_>
         *)pName;
    iVar2 = strcmp(*(char **)((long)&Fossilize::interceptCoreInstanceCommand(char_const*)::
                                     coreInstanceCommands + lVar5),pName);
    lVar1 = lVar5 + 0x10;
  } while (iVar2 != 0);
  p_Var3 = *(PFN_vkVoidFunction *)((long)&PTR_CreateInstance_0017c878 + lVar5);
  if (p_Var3 == (PFN_vkVoidFunction)0x0) {
LAB_0010fa2b:
    if (instance == (VkInstance)0x0) {
      p_Var3 = (PFN_vkVoidFunction)0x0;
    }
    else {
      std::mutex::lock((mutex *)Fossilize::globalLock);
      instance_00 = Fossilize::getLayerData<Fossilize::Instance>(*(void **)instance,m);
      pthread_mutex_unlock((pthread_mutex_t *)Fossilize::globalLock);
      p_Var3 = (*instance_00->gpa)(instance_00->instance,pName);
      if (p_Var3 != (PFN_vkVoidFunction)0x0) {
        lVar1 = 0;
        do {
          lVar5 = lVar1;
          if (lVar5 == 0x20) goto LAB_0010fa93;
          iVar2 = strcmp(*(char **)((long)&Fossilize::interceptInstanceCommand(char_const*)::
                                           instanceCommands + lVar5),pName);
          lVar1 = lVar5 + 0x10;
        } while (iVar2 != 0);
        if (*(PFN_vkVoidFunction *)((long)&PTR_GetPhysicalDeviceProperties2_0017c8b8 + lVar5) !=
            (PFN_vkVoidFunction)0x0) {
          return *(PFN_vkVoidFunction *)((long)&PTR_GetPhysicalDeviceProperties2_0017c8b8 + lVar5);
        }
LAB_0010fa93:
        p_Var4 = Fossilize::interceptDeviceCommand(instance_00,pName);
        if (p_Var4 != (PFN_vkVoidFunction)0x0) {
          return p_Var4;
        }
      }
    }
  }
  return p_Var3;
}

Assistant:

VK_LAYER_EXPORT VKAPI_ATTR PFN_vkVoidFunction VKAPI_CALL VK_LAYER_fossilize_GetInstanceProcAddr(VkInstance instance, const char *pName)
{
	if (!pName)
		return nullptr;

	// We only wrap core Vulkan 1.0 instance commands, no need to check for availability of underlying implementation.
	auto proc = interceptCoreInstanceCommand(pName);
	if (proc)
		return proc;

	// For global instance functions, the assumption is that we cannot call down the chain.
	if (!instance)
		return nullptr;

	Instance *layer;
	{
		lock_guard<mutex> holder{globalLock};
		layer = getLayerData(getDispatchKey(instance), instanceData);
	}

	proc = layer->getProcAddr(pName);

	if (proc)
	{
		auto wrapped_proc = interceptInstanceCommand(pName);
		if (wrapped_proc)
			return wrapped_proc;
	}

	// If the underlying implementation returns nullptr, we also need to return nullptr.
	// This means we never expose wrappers which will end up dispatching into nullptr.
	if (proc)
	{
		auto wrapped_proc = interceptDeviceCommand(layer, pName);
		if (wrapped_proc)
			return wrapped_proc;
	}

	return proc;
}